

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_perl_struct_writer(t_perl_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  members_type *this_00;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  t_type *type;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  t_field **local_68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_60;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  t_struct *tstruct_local;
  ostream *out_local;
  t_perl_generator *this_local;
  
  name.field_2._8_8_ = tstruct;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar2));
  this_00 = t_struct::get_sorted_members((t_struct *)name.field_2._8_8_);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_60);
  poVar4 = std::operator<<(out,"sub write {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"my ($self, $output) = @_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"my $xfer   = 0;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"$xfer += $output->writeStructBegin(\'");
  poVar4 = std::operator<<(poVar4,(string *)&fields);
  poVar4 = std::operator<<(poVar4,"\');");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_68 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  local_60._M_current = local_68;
  while( true ) {
    local_70._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_70);
    if (!bVar1) break;
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_90);
    poVar4 = std::operator<<(poVar4,"if (defined $self->{");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"}) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"$xfer += $output->writeFieldBegin(");
    poVar4 = std::operator<<(poVar4,"\'");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"\', ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    type = t_field::get_type(*pptVar5);
    type_to_enum_abi_cxx11_(&local_b0,this,type);
    poVar4 = std::operator<<(poVar4,(string *)&local_b0);
    poVar4 = std::operator<<(poVar4,", ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    iVar3 = t_field::get_key(*pptVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    tfield = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"self->",&local_d1);
    generate_serialize_field(this,out,tfield,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"$xfer += $output->writeFieldEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_60);
  }
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_f8);
  poVar4 = std::operator<<(poVar4,"$xfer += $output->writeFieldStop();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_118);
  poVar4 = std::operator<<(poVar4,"$xfer += $output->writeStructEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_138);
  poVar4 = std::operator<<(poVar4,"return $xfer;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_perl_generator::generate_perl_struct_writer(ostream& out, t_struct* tstruct) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  out << "sub write {" << endl;

  indent_up();
  indent(out) << "my ($self, $output) = @_;" << endl;
  indent(out) << "my $xfer   = 0;" << endl;

  indent(out) << "$xfer += $output->writeStructBegin('" << name << "');" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    out << indent() << "if (defined $self->{" << (*f_iter)->get_name() << "}) {" << endl;
    indent_up();

    indent(out) << "$xfer += $output->writeFieldBegin("
                << "'" << (*f_iter)->get_name() << "', " << type_to_enum((*f_iter)->get_type())
                << ", " << (*f_iter)->get_key() << ");" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "self->");

    indent(out) << "$xfer += $output->writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}" << endl;
  }

  out << indent() << "$xfer += $output->writeFieldStop();" << endl << indent()
      << "$xfer += $output->writeStructEnd();" << endl;

  out << indent() << "return $xfer;" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;
}